

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTRealTraffic.cpp
# Opt level: O2

void __thiscall RealTrafficConnection::RealTrafficConnection(RealTrafficConnection *this)

{
  _Rb_tree_header *p_Var1;
  
  LTFlightDataChannel::LTFlightDataChannel
            (&this->super_LTFlightDataChannel,DR_CHANNEL_REAL_TRAFFIC_ONLINE,"RealTraffic",
             CHT_TRACKING_DATA);
  (this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel =
       (_func_int **)&PTR__RealTrafficConnection_002bc4b0;
  *(undefined8 *)((long)&(this->rtMutex).super___recursive_mutex_base._M_mutex + 0x10) = 0;
  (this->rtMutex).super___recursive_mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->rtMutex).super___recursive_mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->rtMutex).super___recursive_mutex_base._M_mutex + 8) = 0;
  (this->rtMutex).super___recursive_mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->rtMutex).super___recursive_mutex_base._M_mutex.__data.__kind = 1;
  this->eConnType = RT_CONN_REQU_REPL;
  this->status = RT_STATUS_NONE;
  this->eLicType = RT_LIC_UNKNOWN;
  CurrTy::CurrTy(&this->curr);
  (this->tNextTraffic).__d.__r = 0;
  (this->tNextWeather).__d.__r = 0;
  WxTy::WxTy(&this->rtWx);
  this->lTotalFlights = -1;
  this->bDoParkedTraffic = false;
  (this->thrTcpServer)._M_id._M_thread = 0;
  XPMP2::TCPConnection::TCPConnection(&this->tcpPosSender);
  this->eTcpThrStatus = THR_NONE;
  XPMP2::UDPReceiver::UDPReceiver(&this->udpTrafficData);
  this->udpPipe[0] = -1;
  this->udpPipe[1] = -1;
  this->lastReceivedTime = 0.0;
  (this->mapDatagrams)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mapDatagrams)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->mapDatagrams)._M_t._M_impl.super__Rb_tree_header;
  (this->mapDatagrams)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mapDatagrams)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mapDatagrams)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::_Deque_base<double,_std::allocator<double>_>::_Deque_base
            (&(this->dequeTS).super__Deque_base<double,_std::allocator<double>_>);
  this->tsAdjust = 0.0;
  std::__cxx11::string::assign
            ((char *)&(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
                      urlName);
  std::__cxx11::string::assign
            ((char *)&(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
                      urlLink);
  std::__cxx11::string::assign
            ((char *)&(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
                      urlPopup);
  return;
}

Assistant:

RealTrafficConnection::RealTrafficConnection () :
LTFlightDataChannel(DR_CHANNEL_REAL_TRAFFIC_ONLINE, REALTRAFFIC_NAME)
{
    //purely information
    urlName  = RT_CHECK_NAME;
    urlLink  = RT_CHECK_URL;
    urlPopup = RT_CHECK_POPUP;
}